

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

size_t __thiscall
AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize
          (AccountingTestMemoryAllocator *this,char *memory)

{
  size_t sVar1;
  AccountingTestMemoryAllocatorMemoryNode *local_28;
  AccountingTestMemoryAllocatorMemoryNode *node;
  char *memory_local;
  AccountingTestMemoryAllocator *this_local;
  
  if ((this->head_ == (AccountingTestMemoryAllocatorMemoryNode *)0x0) ||
     (this->head_->memory_ != memory)) {
    for (local_28 = this->head_; local_28 != (AccountingTestMemoryAllocatorMemoryNode *)0x0;
        local_28 = local_28->next_) {
      if ((local_28->next_ != (AccountingTestMemoryAllocatorMemoryNode *)0x0) &&
         (local_28->next_->memory_ == memory)) {
        sVar1 = removeNextNodeAndReturnSize(this,local_28);
        return sVar1;
      }
    }
    this_local = (AccountingTestMemoryAllocator *)0x0;
  }
  else {
    this_local = (AccountingTestMemoryAllocator *)removeHeadAndReturnSize(this);
  }
  return (size_t)this_local;
}

Assistant:

size_t AccountingTestMemoryAllocator::removeMemoryFromTrackingAndReturnAllocatedSize(char* memory)
{
    if (head_ && head_->memory_ == memory)
        return removeHeadAndReturnSize();

    for (AccountingTestMemoryAllocatorMemoryNode* node = head_; node; node = node->next_) {
        if (node->next_ && node->next_->memory_ == memory)
            return removeNextNodeAndReturnSize(node);
    }

    return 0;
}